

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhombicCode.cpp
# Opt level: O1

void __thiscall RhombicCode::sweep(RhombicCode *this,string *direction,bool greedy)

{
  _Rb_tree_header *p_Var1;
  set<int,_std::less<int>,_std::allocator<int>_> *this_00;
  _Rb_tree_header *p_Var2;
  char cVar3;
  uint vertexIndex;
  uint *puVar4;
  _Base_ptr p_Var5;
  pointer pvVar6;
  int *piVar7;
  _Base_ptr p_Var8;
  pointer pcVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  int *piVar13;
  length_error *this_01;
  invalid_argument *piVar14;
  string *sweepDirection;
  _Base_ptr p_Var15;
  undefined7 in_register_00000011;
  long *plVar16;
  const_iterator __position;
  _Base_ptr p_Var17;
  _Rb_tree_header *p_Var18;
  uint *puVar19;
  long lVar20;
  cartesian4 cVar21;
  vstr sweepEdges;
  vstr edgeDirections;
  undefined1 local_b8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined1 local_88 [16];
  long *local_78 [2];
  long local_68 [2];
  vstr local_58;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000011,greedy);
  Code::clearFlipBits(&this->super_Code);
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar11 = std::__cxx11::string::compare((char *)direction);
  if (iVar11 == 0) {
    local_b8._0_8_ = local_b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"xy","");
    local_98._M_allocated_capacity = (size_type)local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"yz","");
    plVar16 = local_68;
    local_78[0] = plVar16;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"xz","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_aux<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_58,
               local_b8,&local_58);
    lVar20 = -0x60;
    do {
      if (plVar16 != (long *)plVar16[-2]) {
        operator_delete((long *)plVar16[-2],*plVar16 + 1);
      }
      plVar16 = plVar16 + -4;
      lVar20 = lVar20 + 0x20;
    } while (lVar20 != 0);
  }
  else {
    iVar11 = std::__cxx11::string::compare((char *)direction);
    if (iVar11 == 0) {
      local_b8._0_8_ = local_b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"xyz","");
      local_98._M_allocated_capacity = (size_type)local_88;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-xz","");
      plVar16 = local_68;
      local_78[0] = plVar16;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"-yz","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_58,
                 local_b8,&local_58);
      lVar20 = -0x60;
      do {
        if (plVar16 != (long *)plVar16[-2]) {
          operator_delete((long *)plVar16[-2],*plVar16 + 1);
        }
        plVar16 = plVar16 + -4;
        lVar20 = lVar20 + 0x20;
      } while (lVar20 != 0);
    }
    else {
      iVar11 = std::__cxx11::string::compare((char *)direction);
      if (iVar11 == 0) {
        local_b8._0_8_ = local_b8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"xyz","");
        local_98._M_allocated_capacity = (size_type)local_88;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-xy","");
        plVar16 = local_68;
        local_78[0] = plVar16;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"-yz","");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_assign_aux<std::__cxx11::string_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_58,
                   local_b8,&local_58);
        lVar20 = -0x60;
        do {
          if (plVar16 != (long *)plVar16[-2]) {
            operator_delete((long *)plVar16[-2],*plVar16 + 1);
          }
          plVar16 = plVar16 + -4;
          lVar20 = lVar20 + 0x20;
        } while (lVar20 != 0);
      }
      else {
        iVar11 = std::__cxx11::string::compare((char *)direction);
        if (iVar11 == 0) {
          local_b8._0_8_ = local_b8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"xyz","");
          local_98._M_allocated_capacity = (size_type)local_88;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-xy","");
          plVar16 = local_68;
          local_78[0] = plVar16;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"-xz","");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_assign_aux<std::__cxx11::string_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_58,
                     local_b8,&local_58);
          lVar20 = -0x60;
          do {
            if (plVar16 != (long *)plVar16[-2]) {
              operator_delete((long *)plVar16[-2],*plVar16 + 1);
            }
            plVar16 = plVar16 + -4;
            lVar20 = lVar20 + 0x20;
          } while (lVar20 != 0);
        }
        else {
          iVar11 = std::__cxx11::string::compare((char *)direction);
          if (iVar11 == 0) {
            local_b8._0_8_ = local_b8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"-xy","");
            local_98._M_allocated_capacity = (size_type)local_88;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-yz","");
            plVar16 = local_68;
            local_78[0] = plVar16;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"-xz","");
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            _M_assign_aux<std::__cxx11::string_const*>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_58,local_b8,&local_58);
            lVar20 = -0x60;
            do {
              if (plVar16 != (long *)plVar16[-2]) {
                operator_delete((long *)plVar16[-2],*plVar16 + 1);
              }
              plVar16 = plVar16 + -4;
              lVar20 = lVar20 + 0x20;
            } while (lVar20 != 0);
          }
          else {
            iVar11 = std::__cxx11::string::compare((char *)direction);
            if (iVar11 == 0) {
              local_b8._0_8_ = local_b8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"-xyz","");
              local_98._M_allocated_capacity = (size_type)local_88;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"xz","");
              plVar16 = local_68;
              local_78[0] = plVar16;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"yz","");
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_assign_aux<std::__cxx11::string_const*>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_58,local_b8,&local_58);
              lVar20 = -0x60;
              do {
                if (plVar16 != (long *)plVar16[-2]) {
                  operator_delete((long *)plVar16[-2],*plVar16 + 1);
                }
                plVar16 = plVar16 + -4;
                lVar20 = lVar20 + 0x20;
              } while (lVar20 != 0);
            }
            else {
              iVar11 = std::__cxx11::string::compare((char *)direction);
              if (iVar11 == 0) {
                local_b8._0_8_ = local_b8 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"-xyz","");
                local_98._M_allocated_capacity = (size_type)local_88;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"xy","");
                plVar16 = local_68;
                local_78[0] = plVar16;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"yz","");
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                _M_assign_aux<std::__cxx11::string_const*>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_58,local_b8,&local_58);
                lVar20 = -0x60;
                do {
                  if (plVar16 != (long *)plVar16[-2]) {
                    operator_delete((long *)plVar16[-2],*plVar16 + 1);
                  }
                  plVar16 = plVar16 + -4;
                  lVar20 = lVar20 + 0x20;
                } while (lVar20 != 0);
              }
              else {
                iVar11 = std::__cxx11::string::compare((char *)direction);
                if (iVar11 != 0) {
                  piVar14 = (invalid_argument *)__cxa_allocate_exception(0x10);
                  std::invalid_argument::invalid_argument(piVar14,"Invalid sweep direction.");
                  __cxa_throw(piVar14,&std::invalid_argument::typeinfo,
                              std::invalid_argument::~invalid_argument);
                }
                local_b8._0_8_ = local_b8 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"-xyz","");
                local_98._M_allocated_capacity = (size_type)local_88;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"xy","");
                plVar16 = local_68;
                local_78[0] = plVar16;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"xz","");
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                _M_assign_aux<std::__cxx11::string_const*>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_58,local_b8,&local_58);
                lVar20 = -0x60;
                do {
                  if (plVar16 != (long *)plVar16[-2]) {
                    operator_delete((long *)plVar16[-2],*plVar16 + 1);
                  }
                  plVar16 = plVar16 + -4;
                  lVar20 = lVar20 + 0x20;
                } while (lVar20 != 0);
              }
            }
          }
        }
      }
    }
  }
  puVar4 = (uint *)(this->super_Code).sweepIndices.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
  for (puVar19 = (uint *)(this->super_Code).sweepIndices.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start; puVar19 != puVar4; puVar19 = puVar19 + 1)
  {
    vertexIndex = *puVar19;
    if (((char)local_34 != '\0') ||
       (bVar10 = Code::checkExtremalVertex(&this->super_Code,vertexIndex,direction), bVar10)) {
      (*(this->super_Code)._vptr_Code[3])(local_b8,this,(ulong)vertexIndex,direction);
      if (0x80 < (ulong)(local_b8._8_8_ - local_b8._0_8_)) {
        this_01 = (length_error *)__cxa_allocate_exception(0x10);
        std::length_error::length_error
                  (this_01,"More than four up-edges found for a rhombic lattice vertex.");
        __cxa_throw(this_01,&std::length_error::typeinfo,std::length_error::~length_error);
      }
      if (local_b8._8_8_ != local_b8._0_8_) {
        cVar21 = Lattice::indexToCoordinate
                           ((this->super_Code).lattice._M_t.
                            super___uniq_ptr_impl<Lattice,_std::default_delete<Lattice>_>._M_t.
                            super__Tuple_impl<0UL,_Lattice_*,_std::default_delete<Lattice>_>.
                            super__Head_base<0UL,_Lattice_*,_false>._M_head_impl,vertexIndex);
        if ((local_b8._8_8_ - local_b8._0_8_ != 0x20) || ((this->super_Code).boundaries != false)) {
          sweepDirection = (string *)(cVar21._8_8_ >> 0x20);
          if (sweepDirection == (string *)0x0) {
            if ((cVar21.z + cVar21.x + cVar21.y) % 2 != this->latticeParity) {
              piVar14 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument
                        (piVar14,"Vertex not present in lattice has up-edges.");
              __cxa_throw(piVar14,&std::invalid_argument::typeinfo,
                          std::invalid_argument::~invalid_argument);
            }
            if ((this->super_Code).boundaries == true) {
              sweepFullVertexBoundary(this,vertexIndex,(vstr *)local_b8,direction,&local_58);
            }
            else {
              sweepFullVertex(this,vertexIndex,(vstr *)local_b8,direction,&local_58);
            }
          }
          else if ((this->super_Code).boundaries == true) {
            sweepHalfVertexBoundary(this,vertexIndex,(vstr *)local_b8,direction,&local_58);
          }
          else {
            sweepHalfVertex(this,vertexIndex,(vstr *)local_b8,sweepDirection,&local_58);
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_b8);
    }
  }
  local_b8._0_8_ = local_b8._0_8_ & 0xffffffff00000000;
  iVar11 = *(int *)&(this->super_Code).flipBits.
                    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
           *(int *)&(this->super_Code).flipBits.
                    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
  if (0 < iVar11) {
    iVar12 = 0;
    this_00 = &(this->super_Code).error;
    p_Var2 = &(this->super_Code).error._M_t._M_impl.super__Rb_tree_header;
    p_Var1 = &(this->super_Code).syndromeIndices._M_t._M_impl.super__Rb_tree_header;
    do {
      if ((this->super_Code).flipBits.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
          _M_impl.super__Vector_impl_data._M_start[iVar12] != '\0') {
        p_Var5 = (this->super_Code).error._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var15 = &p_Var2->_M_header;
        for (; p_Var5 != (_Base_ptr)0x0;
            p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < iVar12]) {
          if (iVar12 <= (int)p_Var5[1]._M_color) {
            p_Var15 = p_Var5;
          }
        }
        __position._M_node = &p_Var2->_M_header;
        if (((_Rb_tree_header *)p_Var15 != p_Var2) &&
           (__position._M_node = p_Var15, iVar12 < (int)p_Var15[1]._M_color)) {
          __position._M_node = &p_Var2->_M_header;
        }
        if ((_Rb_tree_header *)__position._M_node == p_Var2) {
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     this_00,(int *)local_b8);
        }
        else {
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          erase_abi_cxx11_((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                            *)this_00,__position);
        }
        if (1 < (this->super_Code).sweepRate) {
          pvVar6 = (this->super_Code).faceToEdges.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          piVar7 = pvVar6[(int)local_b8._0_4_].super__Vector_base<int,_std::allocator<int>_>._M_impl
                   .super__Vector_impl_data._M_finish;
          for (piVar13 = pvVar6[(int)local_b8._0_4_].super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start; piVar13 != piVar7;
              piVar13 = piVar13 + 1) {
            iVar12 = *piVar13;
            if ((this->super_Code).boundaries == true) {
              p_Var8 = (this->super_Code).syndromeIndices._M_t._M_impl.super__Rb_tree_header.
                       _M_header._M_parent;
              p_Var17 = &p_Var1->_M_header;
              for (; (_Rb_tree_header *)p_Var8 != (_Rb_tree_header *)0x0;
                  p_Var8 = (&p_Var8->_M_left)[(int)*(size_t *)(p_Var8 + 1) < iVar12]) {
                if (iVar12 <= (int)*(size_t *)(p_Var8 + 1)) {
                  p_Var17 = p_Var8;
                }
              }
              p_Var18 = p_Var1;
              if (((_Rb_tree_header *)p_Var17 != p_Var1) &&
                 (p_Var18 = (_Rb_tree_header *)p_Var17,
                 iVar12 < (int)((_Rb_tree_header *)p_Var17)->_M_node_count)) {
                p_Var18 = p_Var1;
              }
              if (p_Var18 != p_Var1) goto LAB_00112632;
            }
            else {
LAB_00112632:
              pcVar9 = (this->super_Code).syndrome.
                       super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              cVar3 = pcVar9[iVar12];
              pcVar9[iVar12] =
                   cVar3 + ((byte)((cVar3 - (char)(cVar3 + 1 >> 0x1f)) + 1U) >> 1) * -2 + '\x01';
            }
          }
        }
      }
      iVar12 = local_b8._0_4_ + 1;
      local_b8._0_4_ = iVar12;
    } while (iVar12 < iVar11);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  return;
}

Assistant:

void RhombicCode::sweep(const std::string &direction, bool greedy)
{
    clearFlipBits();
    vstr edgeDirections;
    if (direction == "xyz")
    {
        edgeDirections = {"xy", "yz", "xz"};
    }
    else if (direction == "xy")
    {
        edgeDirections = {"xyz", "-xz", "-yz"};
    }
    else if (direction == "xz")
    {
        edgeDirections = {"xyz", "-xy", "-yz"};
    }
    else if (direction == "yz")
    {
        edgeDirections = {"xyz", "-xy", "-xz"};
    }
    else if (direction == "-xyz")
    {
        edgeDirections = {"-xy", "-yz", "-xz"};
    }
    else if (direction == "-xy")
    {
        edgeDirections = {"-xyz", "xz", "yz"};
    }
    else if (direction == "-xz")
    {
        edgeDirections = {"-xyz", "xy", "yz"};
    }
    else if (direction == "-yz")
    {
        edgeDirections = {"-xyz", "xy", "xz"};
    }
    else
    {
        throw std::invalid_argument("Invalid sweep direction.");
    }
    // for (int vertexIndex = 0; vertexIndex < 2 * pow(l, 3); ++vertexIndex)
    for (auto const vertexIndex : sweepIndices)
    {
        if (!greedy)
        {
            if (!checkExtremalVertex(vertexIndex, direction))
            {
                continue;
            }
        }
        // std::cout << "Trying to find sweep edges... ";
        vstr sweepEdges = findSweepEdges(vertexIndex, direction);
        // if (sweepEdges.size() > 0)
        // {
        //     std::cerr << "Vertex = " << lattice->indexToCoordinate(vertexIndex) << std::endl;
        //     for (auto &e : sweepEdges)
        //     {
        //         std::cerr << e << std::endl;
        //     }
        // }
        // std::cout << "FOUND." << std::endl;
        if (sweepEdges.size() > 4)
        {
            throw std::length_error("More than four up-edges found for a rhombic lattice vertex.");
        }
        if (sweepEdges.size() == 0)
        {
            continue;
        }
        cartesian4 coordinate = lattice->indexToCoordinate(vertexIndex);
        // if (sweepEdges.size() == 1 && (!boundaries || coordinate.w == 0))
        if (sweepEdges.size() == 1 && !boundaries)
        {
            continue;
        }
        if (coordinate.w == 0)
        {
            if ((coordinate.x + coordinate.y + coordinate.z) % 2 == latticeParity)
            {
                if (boundaries)
                {
                    sweepFullVertexBoundary(vertexIndex, sweepEdges, direction, edgeDirections);
                }
                else
                {
                    sweepFullVertex(vertexIndex, sweepEdges, direction, edgeDirections);
                }
            }
            else
            {
                throw std::invalid_argument("Vertex not present in lattice has up-edges.");
            }
        }
        else
        {
            if (boundaries)
            {
                sweepHalfVertexBoundary(vertexIndex, sweepEdges, direction, edgeDirections);
            }
            else
            {
                sweepHalfVertex(vertexIndex, sweepEdges, direction, edgeDirections);
            }
        }
    }
    for (int i = 0, imax = flipBits.size(); i < imax; ++i)
    {
        if (flipBits[i])
        {
            auto it = error.find(i);
            if (it != error.end())
            {
                error.erase(it);
            }
            else
            {
                error.insert(i);
            }
            if (sweepRate > 1)
            {
                for (const int edge : faceToEdges[i])
                {
                    // std::cerr << edge << std::endl;
                    if (boundaries)
                    {
                        auto it2 = syndromeIndices.find(edge);
                        if (it2 == syndromeIndices.end())
                        {
                            continue;
                        }
                    }
                    syndrome[edge] = (syndrome[edge] + 1) % 2;
                }
            }
        }
    }
}